

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_28::KotlinKMPCodeGenerator::GenerateCode
          (KotlinKMPCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  KotlinKMPGenerator generator;
  KotlinKMPGenerator local_210;
  
  kotlin::KotlinKMPGenerator::KotlinKMPGenerator(&local_210,parser,path,filename);
  bVar1 = kotlin::KotlinKMPGenerator::generate(&local_210);
  local_210.super_BaseGenerator._vptr_BaseGenerator = (_func_int **)&PTR_generate_003e93d0;
  local_210.namer_.super_Namer._vptr_Namer = (_func_int **)&PTR__Namer_003e8dd0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_210.namer_.super_Namer.keywords_._M_t);
  Namer::Config::~Config(&local_210.namer_.super_Namer.config_);
  BaseGenerator::~BaseGenerator(&local_210.super_BaseGenerator);
  return (Status)!bVar1;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateKotlinKMP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }